

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O3

void __thiscall vera::HaveDefines::mergeDefines(HaveDefines *this,DefinesMap *_defines)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (_defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(_defines->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (*this->_vptr_HaveDefines[10])(this,p_Var1 + 1,p_Var1 + 2);
  }
  return;
}

Assistant:

void HaveDefines::mergeDefines( const DefinesMap &_defines ) {
    for (DefinesMap_cit it=_defines.begin(); it != _defines.end(); ++it)
        addDefine(it->first, it->second);
}